

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.h
# Opt level: O1

void slang::DiagnosticEngine::setDefaultFormatter<slang::ast::Type_const*>
               (shared_ptr<slang::DiagArgFormatter> *formatter)

{
  char *pcVar1;
  long lVar2;
  pointer_____offset_0x10___ __s1;
  pointer_____offset_0x10___ __s2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint uVar3;
  undefined1 auVar4 [16];
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *ppVar12;
  long lVar13;
  type_index tVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  locator res;
  try_emplace_args_t local_b1;
  type_index local_b0;
  ulong local_a8;
  __shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2> *local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  type_info *local_80;
  long local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  locator local_48;
  
  local_b0._M_target = (type_info *)&ast::Type_const*::typeinfo;
  sVar8 = std::type_info::hash_code((type_info *)&ast::Type_const*::typeinfo);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar8;
  uVar17 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar11 = uVar17 >> (defaultFormatters & 0x3f);
  lVar10 = (uVar17 & 0xff) * 4;
  cVar22 = (&UNK_004b638c)[lVar10];
  cVar23 = (&UNK_004b638d)[lVar10];
  cVar24 = (&UNK_004b638e)[lVar10];
  cVar25 = (&UNK_004b638f)[lVar10];
  uVar15 = (ulong)((uint)uVar17 & 7);
  uVar19 = 0;
  lVar10 = DAT_006471c8;
  lVar13 = DAT_006471c0;
  tVar14._M_target = local_b0._M_target;
  uVar16 = DAT_006471b8;
  cVar26 = cVar22;
  cVar27 = cVar23;
  cVar28 = cVar24;
  cVar29 = cVar25;
  cVar30 = cVar22;
  cVar31 = cVar23;
  cVar32 = cVar24;
  cVar33 = cVar25;
  cVar34 = cVar22;
  cVar35 = cVar23;
  cVar36 = cVar24;
  cVar37 = cVar25;
  local_60 = uVar11;
  do {
    pcVar1 = (char *)(lVar13 + uVar11 * 0x10);
    auVar21[0] = -(*pcVar1 == cVar22);
    auVar21[1] = -(pcVar1[1] == cVar23);
    auVar21[2] = -(pcVar1[2] == cVar24);
    auVar21[3] = -(pcVar1[3] == cVar25);
    auVar21[4] = -(pcVar1[4] == cVar26);
    auVar21[5] = -(pcVar1[5] == cVar27);
    auVar21[6] = -(pcVar1[6] == cVar28);
    auVar21[7] = -(pcVar1[7] == cVar29);
    auVar21[8] = -(pcVar1[8] == cVar30);
    auVar21[9] = -(pcVar1[9] == cVar31);
    auVar21[10] = -(pcVar1[10] == cVar32);
    auVar21[0xb] = -(pcVar1[0xb] == cVar33);
    auVar21[0xc] = -(pcVar1[0xc] == cVar34);
    auVar21[0xd] = -(pcVar1[0xd] == cVar35);
    auVar21[0xe] = -(pcVar1[0xe] == cVar36);
    auVar21[0xf] = -(pcVar1[0xf] == cVar37);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
    uVar18 = uVar19;
    local_68 = uVar11;
    if (uVar9 != 0) {
      lVar2 = lVar10 + uVar11 * 0x168;
      __s1 = *(pointer_____offset_0x10___ *)(tVar14._M_target + 8);
      local_a8 = uVar17;
      local_a0 = &formatter->super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>
      ;
      local_98 = uVar19;
      local_90 = uVar16;
      local_88 = uVar15;
      local_80 = tVar14._M_target;
      local_78 = lVar10;
      local_70 = lVar13;
      local_58 = cVar22;
      cStack_57 = cVar23;
      cStack_56 = cVar24;
      cStack_55 = cVar25;
      cStack_54 = cVar26;
      cStack_53 = cVar27;
      cStack_52 = cVar28;
      cStack_51 = cVar29;
      cStack_50 = cVar30;
      cStack_4f = cVar31;
      cStack_4e = cVar32;
      cStack_4d = cVar33;
      cStack_4c = cVar34;
      cStack_4b = cVar35;
      cStack_4a = cVar36;
      cStack_49 = cVar37;
      do {
        uVar3 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        __s2 = *(pointer_____offset_0x10___ *)(*(long *)(lVar2 + (ulong)uVar3 * 0x18) + 8);
        if (__s1 == __s2) {
          bVar20 = true;
        }
        else if (*__s1 == '*') {
          bVar20 = false;
        }
        else {
          iVar7 = strcmp(__s1,__s2);
          bVar20 = iVar7 == 0;
          cVar22 = local_58;
          cVar23 = cStack_57;
          cVar24 = cStack_56;
          cVar25 = cStack_55;
          cVar26 = cStack_54;
          cVar27 = cStack_53;
          cVar28 = cStack_52;
          cVar29 = cStack_51;
          cVar30 = cStack_50;
          cVar31 = cStack_4f;
          cVar32 = cStack_4e;
          cVar33 = cStack_4d;
          cVar34 = cStack_4c;
          cVar35 = cStack_4b;
          cVar36 = cStack_4a;
          cVar37 = cStack_49;
        }
        formatter = (shared_ptr<slang::DiagArgFormatter> *)local_a0;
        uVar17 = local_a8;
        if (bVar20) {
          ppVar12 = (pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *)
                    ((ulong)uVar3 * 0x18 + lVar2);
          goto LAB_00153b2f;
        }
        uVar9 = uVar9 - 1 & uVar9;
        lVar10 = local_78;
        lVar13 = local_70;
        tVar14._M_target = local_80;
        uVar15 = local_88;
        uVar16 = local_90;
        uVar18 = local_98;
      } while (uVar9 != 0);
    }
    if ((*(byte *)(uVar11 * 0x10 + lVar13 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar15]) == 0) break;
    uVar19 = uVar18 + 1;
    uVar11 = local_68 + uVar18 + 1 & uVar16;
  } while (uVar19 <= uVar16);
  ppVar12 = (pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *)0x0;
LAB_00153b2f:
  if (ppVar12 == (pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *)0x0) {
    if (DAT_006471d8 < DAT_006471d0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
                  *)&defaultFormatters,(arrays_type *)&defaultFormatters,local_60,uVar17,&local_b1,
                 &local_b0);
      DAT_006471d8 = DAT_006471d8 + 1;
      ppVar12 = local_48.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
                  *)&defaultFormatters,uVar17,&local_b1,&local_b0);
      ppVar12 = local_48.p;
    }
  }
  peVar5 = (formatter->super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var6 = (formatter->super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (formatter->super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (formatter->super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (ppVar12->second).super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (ppVar12->second).super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (ppVar12->second).super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var6;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return;
}

Assistant:

static void setDefaultFormatter(std::shared_ptr<DiagArgFormatter> formatter) {
        defaultFormatters[SLANG_TYPEOF(ForType)] = std::move(formatter);
    }